

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

vec2 __thiscall djb::tab_r::cdfv(tab_r *this,vec2 *u,float_t zi)

{
  float_t fVar1;
  double dVar2;
  vec2 vVar3;
  float local_40;
  float local_3c;
  float_t local_38;
  float_t u3;
  float_t u2;
  float_t u1;
  int res3;
  int res2;
  int res1;
  float_t zi_local;
  vec2 *u_local;
  tab_r *this_local;
  
  res3 = 0x40;
  u1 = 3.58732e-43;
  u2 = 2.24208e-44;
  u3 = u->x;
  local_38 = u->y;
  res2 = (int)zi;
  _res1 = u;
  u_local = (vec2 *)this;
  dVar2 = std::acos((double)(ulong)(uint)zi);
  fVar1 = m_pi();
  local_40 = SUB84(dVar2,0) * (2.0 / fVar1);
  local_3c = sqr<float>(&local_40);
  vVar3 = spline::eval3d<djb::vec2>
                    (&this->m_cdf,res3,(int)u1,(int)u2,spline::uwrap_edge,u3,spline::uwrap_edge,
                     local_38,spline::uwrap_edge,local_3c);
  return vVar3;
}

Assistant:

vec2 tab_r::cdfv(const vec2 &u, float_t zi) const
{
	int res1 = 64;
	int res2 = 256;
	int res3 = 16;
	float_t u1 = u.x;
	float_t u2 = u.y;
	float_t u3 = sqr(acos(zi) * (2 / m_pi()));

	return spline::eval3d(m_cdf, res1, res2, res3,
	                      spline::uwrap_edge, u1,
	                      spline::uwrap_edge, u2,
	                      spline::uwrap_edge, u3);
}